

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

int imagetobmp(opj_image_t *image,char *outfile)

{
  uint uVar1;
  uint uVar2;
  FILE *pFVar3;
  int local_104;
  int local_fc;
  int local_bc;
  int local_b4;
  int local_a4;
  int local_94;
  uint local_58;
  int local_54;
  int r_1;
  int b;
  int g;
  int r;
  OPJ_UINT8 bc;
  OPJ_UINT8 gc;
  int iStack_40;
  OPJ_UINT8 rc;
  int adjustB;
  int adjustG;
  int adjustR;
  FILE *fdest;
  int pad;
  int i;
  int h;
  int w;
  char *outfile_local;
  opj_image_t *image_local;
  
  if (image->comps->prec < 8) {
    fprintf(_stderr,"imagetobmp: Unsupported precision: %d\n",(ulong)image->comps->prec);
    image_local._4_4_ = 1;
  }
  else {
    if ((((((image->numcomps < 3) || (image->comps->dx != image->comps[1].dx)) ||
          (image->comps[1].dx != image->comps[2].dx)) ||
         ((image->comps->dy != image->comps[1].dy || (image->comps[1].dy != image->comps[2].dy))))
        || ((image->comps->prec != image->comps[1].prec ||
            ((image->comps[1].prec != image->comps[2].prec ||
             (image->comps->sgnd != image->comps[1].sgnd)))))) ||
       (image->comps[1].sgnd != image->comps[2].sgnd)) {
      pFVar3 = fopen(outfile,"wb");
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
        return 1;
      }
      if (1 < image->numcomps) {
        fprintf(_stderr,"imagetobmp: only first component of %d is used.\n",(ulong)image->numcomps);
      }
      uVar1 = image->comps->w;
      uVar2 = image->comps->h;
      fprintf(pFVar3,"BM");
      fprintf(pFVar3,"%c%c%c%c",(ulong)(uVar2 * uVar1 + 0x436 + uVar2 * ((int)uVar1 % 2) & 0xff),
              (ulong)((int)(uVar2 * uVar1 + 0x436 + uVar2 * ((int)uVar1 % 2)) >> 8 & 0xff),
              (ulong)((int)(uVar2 * uVar1 + 0x436 + uVar2 * ((int)uVar1 % 2)) >> 0x10 & 0xff),
              (ulong)((int)(uVar2 * uVar1 + 0x436 + uVar1 * ((int)uVar1 % 2)) >> 0x18 & 0xff));
      fprintf(pFVar3,"%c%c%c%c",0,0,0);
      fprintf(pFVar3,"%c%c%c%c",0x36,4,0);
      fprintf(pFVar3,"%c%c%c%c",0x28,0,0);
      fprintf(pFVar3,"%c%c%c%c",(ulong)(uVar1 & 0xff),(ulong)((int)uVar1 >> 8 & 0xff),
              (ulong)((int)uVar1 >> 0x10 & 0xff),(ulong)((int)uVar1 >> 0x18 & 0xff));
      fprintf(pFVar3,"%c%c%c%c",(ulong)(uVar2 & 0xff),(ulong)((int)uVar2 >> 8 & 0xff),
              (ulong)((int)uVar2 >> 0x10 & 0xff),(ulong)((int)uVar2 >> 0x18 & 0xff));
      fprintf(pFVar3,"%c%c",1,0);
      fprintf(pFVar3,"%c%c",8,0);
      fprintf(pFVar3,"%c%c%c%c",0,0,0);
      fprintf(pFVar3,"%c%c%c%c",(ulong)(uVar2 * uVar1 + uVar2 * ((int)uVar1 % 2) & 0xff),
              (ulong)((int)(uVar2 * uVar1 + uVar2 * ((int)uVar1 % 2)) >> 8 & 0xff),
              (ulong)((int)(uVar2 * uVar1 + uVar2 * ((int)uVar1 % 2)) >> 0x10 & 0xff),
              (ulong)((int)(uVar2 * uVar1 + uVar2 * ((int)uVar1 % 2)) >> 0x18 & 0xff));
      fprintf(pFVar3,"%c%c%c%c",0x9a,0x1e,0);
      fprintf(pFVar3,"%c%c%c%c",0x9a,0x1e,0);
      fprintf(pFVar3,"%c%c%c%c",0,1,0);
      fprintf(pFVar3,"%c%c%c%c",0,1,0);
      if (image->comps->prec < 9) {
        adjustB = 0;
      }
      else {
        adjustB = image->comps->prec - 8;
        printf("BMP CONVERSION: Truncating component 0 from %d bits to 8 bits\n",
               (ulong)image->comps->prec);
      }
      for (fdest._4_4_ = 0; (int)fdest._4_4_ < 0x100; fdest._4_4_ = fdest._4_4_ + 1) {
        fprintf(pFVar3,"%c%c%c%c",(ulong)fdest._4_4_,(ulong)fdest._4_4_,(ulong)fdest._4_4_,0);
      }
      for (fdest._4_4_ = 0; (int)fdest._4_4_ < (int)(uVar1 * uVar2); fdest._4_4_ = fdest._4_4_ + 1)
      {
        if (image->comps->sgnd == 0) {
          local_fc = 0;
        }
        else {
          local_fc = 1 << ((char)image->comps->prec - 1U & 0x1f);
        }
        local_58 = local_fc +
                   image->comps->data
                   [(int)((uVar1 * uVar2 - ((int)fdest._4_4_ / (int)uVar1 + 1) * uVar1) +
                         (int)fdest._4_4_ % (int)uVar1)];
        if (0 < adjustB) {
          local_58 = ((int)local_58 >> ((byte)adjustB & 0x1f)) +
                     ((int)local_58 >> ((byte)adjustB - 1 & 0x1f)) % 2;
        }
        if ((int)local_58 < 0x100) {
          if ((int)local_58 < 0) {
            local_58 = 0;
          }
        }
        else {
          local_58 = 0xff;
        }
        fprintf(pFVar3,"%c",(ulong)(local_58 & 0xff));
        if ((int)(fdest._4_4_ + 1) % (int)uVar1 == 0) {
          if ((int)uVar1 % 4 == 0) {
            local_104 = 0;
          }
          else {
            local_104 = 4 - (int)uVar1 % 4;
          }
          for (fdest._0_4_ = local_104; 0 < (int)fdest; fdest._0_4_ = (int)fdest + -1) {
            fprintf(pFVar3,"%c",0);
          }
        }
      }
      fclose(pFVar3);
    }
    else {
      pFVar3 = fopen(outfile,"wb");
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
        return 1;
      }
      uVar1 = image->comps->w;
      uVar2 = image->comps->h;
      fprintf(pFVar3,"BM");
      fprintf(pFVar3,"%c%c%c%c",
              (ulong)(uVar2 * uVar1 * 3 + uVar2 * 3 * ((int)uVar1 % 2) + 0x36 & 0xff),
              (ulong)((int)(uVar2 * uVar1 * 3 + uVar2 * 3 * ((int)uVar1 % 2) + 0x36) >> 8 & 0xff),
              (ulong)((int)(uVar2 * uVar1 * 3 + uVar2 * 3 * ((int)uVar1 % 2) + 0x36) >> 0x10 & 0xff)
              ,(ulong)((int)(uVar2 * uVar1 * 3 + uVar2 * 3 * ((int)uVar1 % 2) + 0x36) >> 0x18 & 0xff
                      ));
      fprintf(pFVar3,"%c%c%c%c",0,0,0);
      fprintf(pFVar3,"%c%c%c%c",0x36,0,0);
      fprintf(pFVar3,"%c%c%c%c",0x28,0,0);
      fprintf(pFVar3,"%c%c%c%c",(ulong)(uVar1 & 0xff),(ulong)((int)uVar1 >> 8 & 0xff),
              (ulong)((int)uVar1 >> 0x10 & 0xff),(ulong)((int)uVar1 >> 0x18 & 0xff));
      fprintf(pFVar3,"%c%c%c%c",(ulong)(uVar2 & 0xff),(ulong)((int)uVar2 >> 8 & 0xff),
              (ulong)((int)uVar2 >> 0x10 & 0xff),(ulong)((int)uVar2 >> 0x18 & 0xff));
      fprintf(pFVar3,"%c%c",1,0);
      fprintf(pFVar3,"%c%c",0x18,0);
      fprintf(pFVar3,"%c%c%c%c",0,0,0);
      fprintf(pFVar3,"%c%c%c%c",(ulong)(uVar2 * 3 * uVar1 + uVar2 * 3 * ((int)uVar1 % 2) & 0xff),
              (ulong)((int)(uVar2 * uVar1 * 3 + uVar2 * 3 * ((int)uVar1 % 2)) >> 8 & 0xff),
              (ulong)((int)(uVar2 * uVar1 * 3 + uVar2 * 3 * ((int)uVar1 % 2)) >> 0x10 & 0xff),
              (ulong)((int)(uVar2 * uVar1 * 3 + uVar2 * 3 * ((int)uVar1 % 2)) >> 0x18 & 0xff));
      fprintf(pFVar3,"%c%c%c%c",0x9a,0x1e,0);
      fprintf(pFVar3,"%c%c%c%c",0x9a,0x1e,0);
      fprintf(pFVar3,"%c%c%c%c",0,0,0);
      fprintf(pFVar3,"%c%c%c%c",0,0,0);
      if (image->comps->prec < 9) {
        adjustB = 0;
      }
      else {
        adjustB = image->comps->prec - 8;
        printf("BMP CONVERSION: Truncating component 0 from %d bits to 8 bits\n",
               (ulong)image->comps->prec);
      }
      if (image->comps[1].prec < 9) {
        iStack_40 = 0;
      }
      else {
        iStack_40 = image->comps[1].prec - 8;
        printf("BMP CONVERSION: Truncating component 1 from %d bits to 8 bits\n",
               (ulong)image->comps[1].prec);
      }
      if (image->comps[2].prec < 9) {
        r = 0;
      }
      else {
        r = image->comps[2].prec - 8;
        printf("BMP CONVERSION: Truncating component 2 from %d bits to 8 bits\n",
               (ulong)image->comps[2].prec);
      }
      for (fdest._4_4_ = 0; (int)fdest._4_4_ < (int)(uVar1 * uVar2); fdest._4_4_ = fdest._4_4_ + 1)
      {
        if (image->comps->sgnd == 0) {
          local_94 = 0;
        }
        else {
          local_94 = 1 << ((char)image->comps->prec - 1U & 0x1f);
        }
        b = local_94 +
            image->comps->data
            [(int)((uVar1 * uVar2 - ((int)fdest._4_4_ / (int)uVar1 + 1) * uVar1) +
                  (int)fdest._4_4_ % (int)uVar1)];
        if (0 < adjustB) {
          b = (b >> ((byte)adjustB & 0x1f)) + (b >> ((byte)adjustB - 1 & 0x1f)) % 2;
        }
        if (b < 0x100) {
          if (b < 0) {
            b = 0;
          }
        }
        else {
          b._0_1_ = 0xff;
        }
        if (image->comps[1].sgnd == 0) {
          local_a4 = 0;
        }
        else {
          local_a4 = 1 << ((char)image->comps[1].prec - 1U & 0x1f);
        }
        r_1 = local_a4 +
              image->comps[1].data
              [(int)((uVar1 * uVar2 - ((int)fdest._4_4_ / (int)uVar1 + 1) * uVar1) +
                    (int)fdest._4_4_ % (int)uVar1)];
        if (0 < iStack_40) {
          r_1 = (r_1 >> ((byte)iStack_40 & 0x1f)) + (r_1 >> ((byte)iStack_40 - 1 & 0x1f)) % 2;
        }
        if (r_1 < 0x100) {
          if (r_1 < 0) {
            r_1 = 0;
          }
        }
        else {
          r_1._0_1_ = 0xff;
        }
        if (image->comps[2].sgnd == 0) {
          local_b4 = 0;
        }
        else {
          local_b4 = 1 << ((char)image->comps[2].prec - 1U & 0x1f);
        }
        local_54 = local_b4 +
                   image->comps[2].data
                   [(int)((uVar1 * uVar2 - ((int)fdest._4_4_ / (int)uVar1 + 1) * uVar1) +
                         (int)fdest._4_4_ % (int)uVar1)];
        if (0 < r) {
          local_54 = (local_54 >> ((byte)r & 0x1f)) + (local_54 >> ((byte)r - 1 & 0x1f)) % 2;
        }
        if (local_54 < 0x100) {
          if (local_54 < 0) {
            local_54 = 0;
          }
        }
        else {
          local_54._0_1_ = 0xff;
        }
        fprintf(pFVar3,"%c%c%c",(ulong)(byte)local_54,(ulong)(byte)r_1,(ulong)(byte)b);
        if ((int)(fdest._4_4_ + 1) % (int)uVar1 == 0) {
          if ((int)(uVar1 * 3) % 4 == 0) {
            local_bc = 0;
          }
          else {
            local_bc = 4 - (int)(uVar1 * 3) % 4;
          }
          for (fdest._0_4_ = local_bc; 0 < (int)fdest; fdest._0_4_ = (int)fdest + -1) {
            fprintf(pFVar3,"%c",0);
          }
        }
      }
      fclose(pFVar3);
    }
    image_local._4_4_ = 0;
  }
  return image_local._4_4_;
}

Assistant:

int imagetobmp(opj_image_t * image, const char *outfile)
{
    int w, h;
    int i, pad;
    FILE *fdest = NULL;
    int adjustR, adjustG, adjustB;

    if (image->comps[0].prec < 8) {
        fprintf(stderr, "imagetobmp: Unsupported precision: %d\n",
                image->comps[0].prec);
        return 1;
    }
    if (image->numcomps >= 3 && image->comps[0].dx == image->comps[1].dx
            && image->comps[1].dx == image->comps[2].dx
            && image->comps[0].dy == image->comps[1].dy
            && image->comps[1].dy == image->comps[2].dy
            && image->comps[0].prec == image->comps[1].prec
            && image->comps[1].prec == image->comps[2].prec
            && image->comps[0].sgnd == image->comps[1].sgnd
            && image->comps[1].sgnd == image->comps[2].sgnd) {

        /* -->> -->> -->> -->>
        24 bits color
        <<-- <<-- <<-- <<-- */

        fdest = fopen(outfile, "wb");
        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return 1;
        }

        w = (int)image->comps[0].w;
        h = (int)image->comps[0].h;

        fprintf(fdest, "BM");

        /* FILE HEADER */
        /* ------------- */
        fprintf(fdest, "%c%c%c%c",
                (OPJ_UINT8)(h * w * 3 + 3 * h * (w % 2) + 54) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2) + 54) >> 8) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2) + 54) >> 16) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2) + 54) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (54) & 0xff, ((54) >> 8) & 0xff, ((54) >> 16) & 0xff,
                ((54) >> 24) & 0xff);

        /* INFO HEADER   */
        /* ------------- */
        fprintf(fdest, "%c%c%c%c", (40) & 0xff, ((40) >> 8) & 0xff, ((40) >> 16) & 0xff,
                ((40) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)((w) & 0xff),
                (OPJ_UINT8)((w) >> 8) & 0xff,
                (OPJ_UINT8)((w) >> 16) & 0xff,
                (OPJ_UINT8)((w) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)((h) & 0xff),
                (OPJ_UINT8)((h) >> 8) & 0xff,
                (OPJ_UINT8)((h) >> 16) & 0xff,
                (OPJ_UINT8)((h) >> 24) & 0xff);
        fprintf(fdest, "%c%c", (1) & 0xff, ((1) >> 8) & 0xff);
        fprintf(fdest, "%c%c", (24) & 0xff, ((24) >> 8) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)(3 * h * w + 3 * h * (w % 2)) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2)) >> 8) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2)) >> 16) & 0xff,
                (OPJ_UINT8)((h * w * 3 + 3 * h * (w % 2)) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (7834) & 0xff, ((7834) >> 8) & 0xff,
                ((7834) >> 16) & 0xff, ((7834) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (7834) & 0xff, ((7834) >> 8) & 0xff,
                ((7834) >> 16) & 0xff, ((7834) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);

        if (image->comps[0].prec > 8) {
            adjustR = (int)image->comps[0].prec - 8;
            printf("BMP CONVERSION: Truncating component 0 from %d bits to 8 bits\n",
                   image->comps[0].prec);
        } else {
            adjustR = 0;
        }
        if (image->comps[1].prec > 8) {
            adjustG = (int)image->comps[1].prec - 8;
            printf("BMP CONVERSION: Truncating component 1 from %d bits to 8 bits\n",
                   image->comps[1].prec);
        } else {
            adjustG = 0;
        }
        if (image->comps[2].prec > 8) {
            adjustB = (int)image->comps[2].prec - 8;
            printf("BMP CONVERSION: Truncating component 2 from %d bits to 8 bits\n",
                   image->comps[2].prec);
        } else {
            adjustB = 0;
        }

        for (i = 0; i < w * h; i++) {
            OPJ_UINT8 rc, gc, bc;
            int r, g, b;

            r = image->comps[0].data[w * h - ((i) / (w) + 1) * w + (i) % (w)];
            r += (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);
            if (adjustR > 0) {
                r = ((r >> adjustR) + ((r >> (adjustR - 1)) % 2));
            }
            if (r > 255) {
                r = 255;
            } else if (r < 0) {
                r = 0;
            }
            rc = (OPJ_UINT8)r;

            g = image->comps[1].data[w * h - ((i) / (w) + 1) * w + (i) % (w)];
            g += (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            if (adjustG > 0) {
                g = ((g >> adjustG) + ((g >> (adjustG - 1)) % 2));
            }
            if (g > 255) {
                g = 255;
            } else if (g < 0) {
                g = 0;
            }
            gc = (OPJ_UINT8)g;

            b = image->comps[2].data[w * h - ((i) / (w) + 1) * w + (i) % (w)];
            b += (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
            if (adjustB > 0) {
                b = ((b >> adjustB) + ((b >> (adjustB - 1)) % 2));
            }
            if (b > 255) {
                b = 255;
            } else if (b < 0) {
                b = 0;
            }
            bc = (OPJ_UINT8)b;

            fprintf(fdest, "%c%c%c", bc, gc, rc);

            if ((i + 1) % w == 0) {
                for (pad = ((3 * w) % 4) ? (4 - (3 * w) % 4) : 0; pad > 0; pad--) { /* ADD */
                    fprintf(fdest, "%c", 0);
                }
            }
        }
        fclose(fdest);
    } else {            /* Gray-scale */

        /* -->> -->> -->> -->>
        8 bits non code (Gray scale)
        <<-- <<-- <<-- <<-- */

        fdest = fopen(outfile, "wb");
        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return 1;
        }
        if (image->numcomps > 1) {
            fprintf(stderr, "imagetobmp: only first component of %d is used.\n",
                    image->numcomps);
        }
        w = (int)image->comps[0].w;
        h = (int)image->comps[0].h;

        fprintf(fdest, "BM");

        /* FILE HEADER */
        /* ------------- */
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)(h * w + 54 + 1024 + h * (w % 2)) & 0xff,
                (OPJ_UINT8)((h * w + 54 + 1024 + h * (w % 2)) >> 8) & 0xff,
                (OPJ_UINT8)((h * w + 54 + 1024 + h * (w % 2)) >> 16) & 0xff,
                (OPJ_UINT8)((h * w + 54 + 1024 + w * (w % 2)) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (54 + 1024) & 0xff, ((54 + 1024) >> 8) & 0xff,
                ((54 + 1024) >> 16) & 0xff,
                ((54 + 1024) >> 24) & 0xff);

        /* INFO HEADER */
        /* ------------- */
        fprintf(fdest, "%c%c%c%c", (40) & 0xff, ((40) >> 8) & 0xff, ((40) >> 16) & 0xff,
                ((40) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)((w) & 0xff),
                (OPJ_UINT8)((w) >> 8) & 0xff,
                (OPJ_UINT8)((w) >> 16) & 0xff,
                (OPJ_UINT8)((w) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)((h) & 0xff),
                (OPJ_UINT8)((h) >> 8) & 0xff,
                (OPJ_UINT8)((h) >> 16) & 0xff,
                (OPJ_UINT8)((h) >> 24) & 0xff);
        fprintf(fdest, "%c%c", (1) & 0xff, ((1) >> 8) & 0xff);
        fprintf(fdest, "%c%c", (8) & 0xff, ((8) >> 8) & 0xff);
        fprintf(fdest, "%c%c%c%c", (0) & 0xff, ((0) >> 8) & 0xff, ((0) >> 16) & 0xff,
                ((0) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (OPJ_UINT8)(h * w + h * (w % 2)) & 0xff,
                (OPJ_UINT8)((h * w + h * (w % 2)) >> 8) &  0xff,
                (OPJ_UINT8)((h * w + h * (w % 2)) >> 16) & 0xff,
                (OPJ_UINT8)((h * w + h * (w % 2)) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (7834) & 0xff, ((7834) >> 8) & 0xff,
                ((7834) >> 16) & 0xff, ((7834) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (7834) & 0xff, ((7834) >> 8) & 0xff,
                ((7834) >> 16) & 0xff, ((7834) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (256) & 0xff, ((256) >> 8) & 0xff,
                ((256) >> 16) & 0xff, ((256) >> 24) & 0xff);
        fprintf(fdest, "%c%c%c%c", (256) & 0xff, ((256) >> 8) & 0xff,
                ((256) >> 16) & 0xff, ((256) >> 24) & 0xff);

        if (image->comps[0].prec > 8) {
            adjustR = (int)image->comps[0].prec - 8;
            printf("BMP CONVERSION: Truncating component 0 from %d bits to 8 bits\n",
                   image->comps[0].prec);
        } else {
            adjustR = 0;
        }

        for (i = 0; i < 256; i++) {
            fprintf(fdest, "%c%c%c%c", i, i, i, 0);
        }

        for (i = 0; i < w * h; i++) {
            int r;

            r = image->comps[0].data[w * h - ((i) / (w) + 1) * w + (i) % (w)];
            r += (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);
            if (adjustR > 0) {
                r = ((r >> adjustR) + ((r >> (adjustR - 1)) % 2));
            }
            if (r > 255) {
                r = 255;
            } else if (r < 0) {
                r = 0;
            }

            fprintf(fdest, "%c", (OPJ_UINT8)r);

            if ((i + 1) % w == 0) {
                for (pad = (w % 4) ? (4 - w % 4) : 0; pad > 0; pad--) { /* ADD */
                    fprintf(fdest, "%c", 0);
                }
            }
        }
        fclose(fdest);
    }

    return 0;
}